

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O1

StringPtr capnp::operator*(undefined8 *param_1)

{
  ArrayPtr<const_char> AVar1;
  StructReader local_68;
  PointerReader local_38;
  
  local_38.pointer = *(WirePointer **)(*(long *)*param_1 + 8);
  local_38.segment = (SegmentReader *)0x0;
  local_38.capTable = (CapTableReader *)0x0;
  local_38.nestingLimit = 0x7fffffff;
  _::PointerReader::getStruct(&local_68,&local_38,(word *)0x0);
  if (local_68.pointerCount == 0) {
    local_68.nestingLimit = 0x7fffffff;
    local_68.pointers = (WirePointer *)0x0;
    local_68.segment = (SegmentReader *)0x0;
    local_68.capTable = (CapTableReader *)0x0;
  }
  local_38.segment = local_68.segment;
  local_38.capTable = local_68.capTable;
  local_38.pointer = local_68.pointers;
  local_38.nestingLimit = local_68.nestingLimit;
  AVar1 = (ArrayPtr<const_char>)_::PointerReader::getBlob<capnp::Text>(&local_38,(void *)0x0,0);
  return (StringPtr)AVar1;
}

Assistant:

schema::Node::Reader Schema::getProto() const {
  return readMessageUnchecked<schema::Node>(raw->generic->encodedNode);
}